

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab-begin.c
# Opt level: O3

int CheckFromArray(void)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  char buf [128];
  char local_98 [136];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar2 = 0xffffffff;
  }
  else {
    local_98[0x70] = '\0';
    local_98[0x71] = '\0';
    local_98[0x72] = '\0';
    local_98[0x73] = '\0';
    local_98[0x74] = '\0';
    local_98[0x75] = '\0';
    local_98[0x76] = '\0';
    local_98[0x77] = '\0';
    local_98[0x78] = '\0';
    local_98[0x79] = '\0';
    local_98[0x7a] = '\0';
    local_98[0x7b] = '\0';
    local_98[0x7c] = '\0';
    local_98[0x7d] = '\0';
    local_98[0x7e] = '\0';
    local_98[0x7f] = '\0';
    local_98[0x60] = '\0';
    local_98[0x61] = '\0';
    local_98[0x62] = '\0';
    local_98[99] = '\0';
    local_98[100] = '\0';
    local_98[0x65] = '\0';
    local_98[0x66] = '\0';
    local_98[0x67] = '\0';
    local_98[0x68] = '\0';
    local_98[0x69] = '\0';
    local_98[0x6a] = '\0';
    local_98[0x6b] = '\0';
    local_98[0x6c] = '\0';
    local_98[0x6d] = '\0';
    local_98[0x6e] = '\0';
    local_98[0x6f] = '\0';
    local_98[0x50] = '\0';
    local_98[0x51] = '\0';
    local_98[0x52] = '\0';
    local_98[0x53] = '\0';
    local_98[0x54] = '\0';
    local_98[0x55] = '\0';
    local_98[0x56] = '\0';
    local_98[0x57] = '\0';
    local_98[0x58] = '\0';
    local_98[0x59] = '\0';
    local_98[0x5a] = '\0';
    local_98[0x5b] = '\0';
    local_98[0x5c] = '\0';
    local_98[0x5d] = '\0';
    local_98[0x5e] = '\0';
    local_98[0x5f] = '\0';
    local_98[0x40] = '\0';
    local_98[0x41] = '\0';
    local_98[0x42] = '\0';
    local_98[0x43] = '\0';
    local_98[0x44] = '\0';
    local_98[0x45] = '\0';
    local_98[0x46] = '\0';
    local_98[0x47] = '\0';
    local_98[0x48] = '\0';
    local_98[0x49] = '\0';
    local_98[0x4a] = '\0';
    local_98[0x4b] = '\0';
    local_98[0x4c] = '\0';
    local_98[0x4d] = '\0';
    local_98[0x4e] = '\0';
    local_98[0x4f] = '\0';
    local_98[0x30] = '\0';
    local_98[0x31] = '\0';
    local_98[0x32] = '\0';
    local_98[0x33] = '\0';
    local_98[0x34] = '\0';
    local_98[0x35] = '\0';
    local_98[0x36] = '\0';
    local_98[0x37] = '\0';
    local_98[0x38] = '\0';
    local_98[0x39] = '\0';
    local_98[0x3a] = '\0';
    local_98[0x3b] = '\0';
    local_98[0x3c] = '\0';
    local_98[0x3d] = '\0';
    local_98[0x3e] = '\0';
    local_98[0x3f] = '\0';
    local_98[0x20] = '\0';
    local_98[0x21] = '\0';
    local_98[0x22] = '\0';
    local_98[0x23] = '\0';
    local_98[0x24] = '\0';
    local_98[0x25] = '\0';
    local_98[0x26] = '\0';
    local_98[0x27] = '\0';
    local_98[0x28] = '\0';
    local_98[0x29] = '\0';
    local_98[0x2a] = '\0';
    local_98[0x2b] = '\0';
    local_98[0x2c] = '\0';
    local_98[0x2d] = '\0';
    local_98[0x2e] = '\0';
    local_98[0x2f] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[0x18] = '\0';
    local_98[0x19] = '\0';
    local_98[0x1a] = '\0';
    local_98[0x1b] = '\0';
    local_98[0x1c] = '\0';
    local_98[0x1d] = '\0';
    local_98[0x1e] = '\0';
    local_98[0x1f] = '\0';
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    pcVar3 = ScanChars((FILE *)__stream,0x80,local_98);
    fclose(__stream);
    if (pcVar3 == "PASSED") {
      pcVar3 = strchr(local_98,0x2e);
      if (pcVar3 != (char *)0x0) {
        sVar4 = strlen(local_98);
        strncpy(local_98 + sVar4,"00000000000000000000000000000000",0x7f - sVar4);
      }
      pcVar3 = testInOut[testN].out;
      sVar4 = strlen(pcVar3);
      iVar1 = strncasecmp(pcVar3,local_98,sVar4);
      if (iVar1 == 0) {
        pcVar3 = "PASSED";
      }
      else {
        pcVar3 = "FAILED";
      }
    }
    puts(pcVar3);
    uVar2 = (uint)(pcVar3 == "FAILED");
  }
  testN = testN + 1;
  return uVar2;
}

Assistant:

static int CheckFromArray(void) {
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    char buf[128] = {0};
    const char* status = ScanChars(out, sizeof(buf), buf);
    fclose(out);
    if (status == Pass && strchr(buf, '.')) {
        strncpy(buf + strlen(buf), "0000""0000""0000""0000""0000""0000""0000""0000", sizeof(buf) - strlen(buf) - 1);
    }
    if (status == Pass && _strnicmp(testInOut[testN].out, buf, strlen(testInOut[testN].out)) != 0) {
        status = Fail;
    }
    printf("%s\n", status);
    ++testN;
    return status == Fail;
}